

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alGetSourceiv(ALuint name,ALenum param,ALint *values)

{
  uint32 x;
  uint uVar1;
  uint uVar2;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourceiv);
  writele32(name);
  writele32(param);
  IO_UINT64((uint64)values);
  uVar2 = 1;
  if (((0x26 < param - 0x1001U) || ((0x7d80308143U >> ((ulong)(param - 0x1001U) & 0x3f) & 1) == 0))
     && (param != 0x202)) {
    uVar2 = 0;
  }
  uVar1 = 0;
  if (values == (ALint *)0x0) {
    uVar2 = 0;
  }
  if (uVar2 != 0) {
    *values = 0;
  }
  (*REAL_alGetSourceiv)(name,param,values);
  x = uVar2;
  while( true ) {
    writele32(x);
    if (uVar2 <= uVar1) break;
    x = *values;
    uVar1 = 1;
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourceiv(ALuint name, ALenum param, ALint *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alGetSourceiv);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_SOURCE_STATE: break;
        case AL_SOURCE_RELATIVE: break;
        case AL_LOOPING: break;
        case AL_BUFFER: break;
        case AL_BUFFERS_QUEUED: break;
        case AL_BUFFERS_PROCESSED: break;
        case AL_SOURCE_TYPE: break;
        case AL_REFERENCE_DISTANCE: break;
        case AL_ROLLOFF_FACTOR: break;
        case AL_MAX_DISTANCE: break;
        case AL_CONE_INNER_ANGLE: break;
        case AL_CONE_OUTER_ANGLE: break;
        case AL_SEC_OFFSET: break;
        case AL_SAMPLE_OFFSET: break;
        case AL_BYTE_OFFSET: break;
        default: numvals = 0; break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALint));
    }

    REAL_alGetSourceiv(name, param, values);

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }

    IO_END();
}